

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Receiver_PDU::Receiver_PDU
          (Receiver_PDU *this,EntityIdentifier *ID,KUINT16 RadioID,TransmitState TS,
          KFLOAT32 ReceivingPower,EntityIdentifier *TransmitterID,KUINT16 TransmitterRadioID)

{
  KUINT16 KVar1;
  
  Radio_Communications_Header::Radio_Communications_Header
            (&this->super_Radio_Communications_Header,ID,RadioID);
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Receiver_PDU_00223a90;
  *(short *)&(this->super_Radio_Communications_Header).field_0x3a = (short)TS;
  *(undefined2 *)&(this->super_Radio_Communications_Header).field_0x3c = 0;
  this->m_f32RecPwr = ReceivingPower;
  (this->m_TransmitterEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00220c98;
  KVar1 = (TransmitterID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_TransmitterEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (TransmitterID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_TransmitterEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_TransmitterEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00220c00;
  *(undefined2 *)&(this->m_TransmitterEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(TransmitterID->super_SimulationIdentifier).field_0xc;
  this->m_ui16TransmitterRadioID = TransmitterRadioID;
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x1b';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x24;
  return;
}

Assistant:

Receiver_PDU::Receiver_PDU( const EntityIdentifier & ID, KUINT16 RadioID, TransmitState TS,
                            KFLOAT32 ReceivingPower, const EntityIdentifier & TransmitterID,
                            KUINT16 TransmitterRadioID ) :
    Radio_Communications_Header( ID, RadioID ),
    m_ui16ReceiverState( TS ),
    m_ui16Padding1( 0 ),
    m_f32RecPwr( ReceivingPower ),
    m_TransmitterEntityID( TransmitterID ),
    m_ui16TransmitterRadioID( TransmitterRadioID )
{
    m_ui8PDUType = Receiver_PDU_Type;
    m_ui16PDULength = RECEIVER_PDU_SIZE;
}